

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O0

int factorf(int M)

{
  undefined4 local_10;
  int N;
  int M_local;
  
  for (local_10 = M; local_10 % 7 == 0; local_10 = local_10 / 7) {
  }
  for (; local_10 % 3 == 0; local_10 = local_10 / 3) {
  }
  for (; local_10 % 5 == 0; local_10 = local_10 / 5) {
  }
  for (; local_10 % 2 == 0; local_10 = local_10 / 2) {
  }
  return local_10;
}

Assistant:

int factorf(int M) {
	int N;
	N = M;
	while (N%7 == 0){
			N = N/7;
		}
	while (N%3 == 0){
			N = N/3;
		}
	while (N%5 == 0){
			N = N/5;
		}
	while (N%2 == 0){
			N = N/2;
		}

	return N;
}